

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O3

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::collect_changes
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uchar uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  iterator iVar5;
  Graph *pGVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  DynamicPartialIndex *this_01;
  uint *nxt;
  Graph *__args;
  uint local_34;
  
  uVar8 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = uVar8;
  if (uVar8 < (ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
    if ((puVar3[uVar8] == '\0') || (bVar7 = has_parent(this,s,reverse_graph,dist), bVar7)) {
LAB_0010bb45:
      uVar8 = this->back_;
      uVar11 = this->front_;
      if (uVar8 != this->front_) {
        do {
          uVar9 = uVar11 + 1;
          this->front_ = uVar9;
          puVar4 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->queue_->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <= uVar11)
          goto LAB_0010bcb8;
          uVar11 = (ulong)puVar4[uVar11];
          this_01 = (DynamicPartialIndex *)
                    (graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar10 = ((long)(graph->
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)this_01 >> 3) *
                   -0x5555555555555555;
          if (uVar10 < uVar11 || uVar10 - uVar11 == 0) goto LAB_0010bcb8;
          __args = *(Graph **)
                    &((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&this_01->parent_
                     )[uVar11]._M_impl.super__Vector_impl_data;
          pGVar6 = (&this_01->graph_)[uVar11 * 3];
          if (__args != pGVar6) {
            do {
              uVar2 = *(uint *)&(__args->succ_).
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              uVar11 = (ulong)uVar2;
              puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(dist->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <= uVar11)
              goto LAB_0010bcb8;
              uVar1 = puVar3[uVar11];
              if (((uVar1 != '\0') && (uVar1 != '?')) &&
                 (bVar7 = has_parent(this_01,uVar2,reverse_graph,dist), !bVar7)) {
                uVar2 = *(uint *)&(__args->succ_).
                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                uVar11 = this->back_;
                this->back_ = uVar11 + 1;
                puVar4 = (this->queue_->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->queue_->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <=
                    uVar11) goto LAB_0010bcb8;
                puVar4[uVar11] = uVar2;
                uVar11 = (ulong)*(uint *)&(__args->succ_).
                                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(dist->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) <=
                    uVar11) goto LAB_0010bcb8;
                puVar3[uVar11] = '?';
                this_01 = (DynamicPartialIndex *)this->updated_;
                iVar5._M_current = (uint *)this_01->graph_;
                if (iVar5._M_current == *(uint **)&this_01->k_) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_01,iVar5,
                             (uint *)__args);
                }
                else {
                  *iVar5._M_current =
                       *(uint *)&(__args->succ_).
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  this_01->graph_ = (Graph *)(iVar5._M_current + 1);
                }
              }
              __args = (Graph *)((long)&(__args->succ_).
                                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 4);
            } while (__args != pGVar6);
            uVar8 = this->back_;
            uVar9 = this->front_;
          }
          uVar11 = uVar9;
        } while (uVar8 != uVar9);
      }
      return;
    }
    uVar11 = this->back_;
    this->back_ = uVar11 + 1;
    puVar4 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if (uVar11 < (ulong)((long)(this->queue_->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2)) {
      puVar4[uVar11] = s;
      puVar3 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = uVar8;
      if (uVar8 < (ulong)((long)(dist->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
        puVar3[uVar8] = '?';
        this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->updated_;
        iVar5._M_current = *(uint **)(this_00 + 8);
        if (iVar5._M_current == *(uint **)(this_00 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(this_00,iVar5,&local_34);
        }
        else {
          *iVar5._M_current = s;
          *(uint **)(this_00 + 8) = iVar5._M_current + 1;
        }
        goto LAB_0010bb45;
      }
    }
  }
LAB_0010bcb8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
}

Assistant:

void
DynamicScalableKReach::DynamicPartialIndex::collect_changes(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                            const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                            std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    if (dist.at(s) > 0 && !has_parent(s, reverse_graph, dist)) {
        queue_.at(back_++) = s;
        dist.at(s) = INF8;
        updated_.push_back(s);
    }
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8 && dist.at(nxt) > 0 && !has_parent(nxt, reverse_graph, dist)) {
                queue_.at(back_++) = nxt;
                dist.at(nxt) = INF8;
                updated_.push_back(nxt);
            }
        }
    }
}